

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * __thiscall
Catch::Totals::delta(Totals *__return_storage_ptr__,Totals *this,Totals *prevTotals)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  sVar1 = (this->assertions).failed;
  sVar2 = (prevTotals->assertions).failed;
  (__return_storage_ptr__->assertions).passed =
       (this->assertions).passed - (prevTotals->assertions).passed;
  (__return_storage_ptr__->assertions).failed = sVar1 - sVar2;
  sVar3 = (this->testCases).passed - (prevTotals->testCases).passed;
  sVar4 = (this->testCases).failed - (prevTotals->testCases).failed;
  (__return_storage_ptr__->testCases).passed = sVar3;
  (__return_storage_ptr__->testCases).failed = sVar4;
  if (sVar1 == sVar2) {
    sVar4 = sVar3;
  }
  (&(__return_storage_ptr__->testCases).passed)[sVar1 != sVar2] = sVar4 + 1;
  return __return_storage_ptr__;
}

Assistant:

Totals delta( Totals const& prevTotals ) const {
            Totals diff = *this - prevTotals;
            if( diff.assertions.failed > 0 )
                ++diff.testCases.failed;
            else
                ++diff.testCases.passed;
            return diff;
        }